

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringCache.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::CharStringCache::GetStringForCharSP(CharStringCache *this,codepoint_t c)

{
  code *pcVar1;
  bool bVar2;
  JavascriptString *pJVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext;
  char16 local_24;
  char16 local_22 [3];
  char16 buffer [2];
  
  if (c < 0x10000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CharStringCache.cpp"
                                ,0x4f,"(c >= 0x10000)","c >= 0x10000");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    scriptContext = (ScriptContext *)this[-5].charStringCacheA[0x73].ptr;
  }
  else {
    scriptContext = (ScriptContext *)this[-5].charStringCacheA[0x73].ptr;
    if (0x10ffff < c) {
      pJVar3 = ScriptContext::GetIntegerString(scriptContext,c);
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ea20,pJVar3);
    }
  }
  NumberUtilities::CodePointAsSurrogatePair(c,&local_24,local_22);
  pJVar3 = JavascriptString::NewCopyBuffer(&local_24,2,scriptContext);
  return pJVar3;
}

Assistant:

JavascriptString* CharStringCache::GetStringForCharSP(codepoint_t c)
    {
        Assert(c >= 0x10000);
        CompileAssert(sizeof(char16) * 2 == sizeof(codepoint_t));

        ScriptContext* scriptContext = JavascriptLibrary::FromCharStringCache(this)->GetScriptContext();

        // #sec - string.fromcodepoint: "If nextCP < 0 or nextCP > 0x10FFFF, throw a RangeError exception"
        if (c > 0x10FFFF)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidCodePoint, scriptContext->GetIntegerString(c));
        }

        char16 buffer[2];

        Js::NumberUtilities::CodePointAsSurrogatePair(c, buffer, buffer + 1);
        JavascriptString* str = JavascriptString::NewCopyBuffer(buffer, 2, scriptContext);
        // TODO: perhaps do some sort of cache for supplementary characters
        return str;
    }